

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::InsertShiftedInfo
          (MemoryOutputStream *this,string *insertion_content,size_t insertion_offset,
          size_t indent_length,GeneratedCodeInfo *target_info)

{
  int32_t *piVar1;
  GeneratedCodeInfo_Annotation *from;
  void **ppvVar2;
  const_iterator cVar3;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::GeneratedCodeInfo_Annotation>_>
  *this_00;
  ulong uVar4;
  ulong uVar5;
  anon_union_32_1_493b367e_for_GeneratedCodeInfo_3 *this_01;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  
  lVar8 = insertion_offset + indent_length;
  this_01 = &(this->info_to_insert_).field_0;
  ppvVar2 = internal::RepeatedPtrFieldBase::elements((RepeatedPtrFieldBase *)&this_01->_impl_);
  cVar3 = RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>::end
                    (&(this_01->_impl_).annotation_);
  uVar6 = 0;
  for (; ppvVar2 != cVar3.it_; ppvVar2 = ppvVar2 + 1) {
    from = (GeneratedCodeInfo_Annotation *)*ppvVar2;
    this_00 = internal::RepeatedPtrFieldBase::
              Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::GeneratedCodeInfo_Annotation>>
                        ((RepeatedPtrFieldBase *)&(target_info->field_0)._impl_);
    uVar5 = (ulong)(from->field_0)._impl_.end_;
    uVar4 = insertion_content->_M_string_length - 1;
    if (uVar5 < uVar4) {
      uVar4 = uVar5;
    }
    uVar7 = 0;
    for (; uVar6 < uVar4; uVar6 = uVar6 + 1) {
      if ((insertion_content->_M_dataplus)._M_p[uVar6] == '\n') {
        if (uVar6 < (ulong)(long)(from->field_0)._impl_.begin_) {
          lVar8 = lVar8 + indent_length;
        }
        else {
          uVar7 = uVar7 + (int)indent_length;
        }
      }
    }
    GeneratedCodeInfo_Annotation::CopyFrom(this_00,from);
    piVar1 = &(this_00->field_0)._impl_.begin_;
    *piVar1 = *piVar1 + (int)lVar8;
    lVar8 = lVar8 + (ulong)uVar7;
    piVar1 = &(this_00->field_0)._impl_.end_;
    *piVar1 = *piVar1 + (int)lVar8;
    *(byte *)&this_00->field_0 = *(byte *)&this_00->field_0 | 6;
  }
  return;
}

Assistant:

void CommandLineInterface::MemoryOutputStream::InsertShiftedInfo(
    const std::string& insertion_content, size_t insertion_offset,
    size_t indent_length, google::protobuf::GeneratedCodeInfo& target_info) {
  // Keep track of how much extra data was added for indents before the
  // current annotation being inserted. `pos` and `source_annotation.begin()`
  // are offsets in `insertion_content`. `insertion_offset` is updated so that
  // it can be added to an annotation's `begin` field to reflect that
  // annotation's updated location after `insertion_content` was inserted into
  // the target file.
  size_t pos = 0;
  insertion_offset += indent_length;
  for (const auto& source_annotation : info_to_insert_.annotation()) {
    GeneratedCodeInfo::Annotation* annotation = target_info.add_annotation();
    int inner_indent = 0;
    // insertion_content is guaranteed to end in an endline. This last endline
    // has no effect on indentation.
    for (; pos < static_cast<size_t>(source_annotation.end()) &&
           pos < insertion_content.size() - 1;
         ++pos) {
      if (insertion_content[pos] == '\n') {
        if (pos >= static_cast<size_t>(source_annotation.begin())) {
          // The beginning of the annotation is at insertion_offset, but the end
          // can still move further in the target file.
          inner_indent += indent_length;
        } else {
          insertion_offset += indent_length;
        }
      }
    }
    *annotation = source_annotation;
    annotation->set_begin(annotation->begin() + insertion_offset);
    insertion_offset += inner_indent;
    annotation->set_end(annotation->end() + insertion_offset);
  }
}